

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffdrec(fitsfile *fptr,int keypos,int *status)

{
  undefined1 *puVar1;
  int *status_00;
  int *in_RDX;
  uint in_ESI;
  int *in_RDI;
  char message [81];
  char buff2 [81];
  char buff1 [81];
  char *tmpbuff;
  char *outbuff;
  char *inbuff;
  LONGLONG bytepos;
  int nshift;
  int ii;
  char local_168 [4];
  int in_stack_fffffffffffffe9c;
  LONGLONG in_stack_fffffffffffffea0;
  fitsfile *in_stack_fffffffffffffea8;
  int *in_stack_fffffffffffffed0;
  void *in_stack_fffffffffffffed8;
  int *in_stack_fffffffffffffee0;
  fitsfile *in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef0;
  fitsfile *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  fitsfile *in_stack_ffffffffffffff08;
  undefined1 local_a8 [96];
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  long local_30;
  int local_28;
  int local_24;
  int *local_20;
  uint local_14;
  int *local_10;
  int local_4;
  
  if (*in_RDX < 1) {
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
             &in_stack_fffffffffffffef8->HDUposition,in_stack_fffffffffffffef0);
    }
    if (((int)local_14 < 1) ||
       (status_00 = (int *)(long)(int)local_14,
       *(long *)(*(long *)(local_10 + 2) + 0x70) -
       *(long *)(*(long *)(*(long *)(local_10 + 2) + 0x68) +
                (long)*(int *)(*(long *)(local_10 + 2) + 0x54) * 8) / 0x50 < (long)status_00)) {
      *local_20 = 0xcb;
      local_4 = 0xcb;
    }
    else {
      *(long *)(*(long *)(local_10 + 2) + 0x80) =
           *(long *)(*(long *)(*(long *)(local_10 + 2) + 0x68) +
                    (long)*(int *)(*(long *)(local_10 + 2) + 0x54) * 8) +
           (long)(int)((local_14 - 1) * 0x50);
      local_28 = (int)((*(long *)(*(long *)(local_10 + 2) + 0x70) -
                       *(long *)(*(long *)(local_10 + 2) + 0x80)) / 0x50);
      if (local_28 < 1) {
        snprintf(local_168,0x51,"Cannot delete keyword number %d.  It does not exist.",
                 (ulong)local_14);
        ffpmsg((char *)0x2129b5);
        *local_20 = 0xcb;
        local_4 = 0xcb;
      }
      else {
        local_30 = *(long *)(*(long *)(local_10 + 2) + 0x70) + -0x50;
        strcpy(&stack0xfffffffffffffef8,"                                        ");
        strcat(&stack0xfffffffffffffef8,"                                        ");
        local_38 = local_a8;
        local_40 = &stack0xfffffffffffffef8;
        for (local_24 = 0; local_24 < local_28; local_24 = local_24 + 1) {
          ffmbyt(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                 status_00);
          ffgbyt(in_stack_fffffffffffffee8,(LONGLONG)in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
          ffmbyt(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                 status_00);
          ffpbyt(in_stack_fffffffffffffef8,(LONGLONG)in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
          puVar1 = local_38;
          local_48 = local_38;
          local_38 = local_40;
          local_40 = puVar1;
          local_30 = local_30 + -0x50;
        }
        *(long *)(*(long *)(local_10 + 2) + 0x70) =
             *(long *)(*(long *)(local_10 + 2) + 0x70) + -0x50;
        local_4 = *local_20;
      }
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffdrec(fitsfile *fptr,   /* I - FITS file pointer  */
           int keypos,       /* I - position in header of keyword to delete */
           int *status)      /* IO - error status      */
/*
  Delete a header keyword at position keypos. The 1st keyword is at keypos=1.
*/
{
    int ii, nshift;
    LONGLONG bytepos;
    char *inbuff, *outbuff, *tmpbuff, buff1[81], buff2[81];
    char message[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (keypos < 1 ||
        keypos > (fptr->Fptr)->headend - (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] / 80 )
        return(*status = KEY_OUT_BOUNDS);

    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] + (keypos - 1) * 80;

    nshift=(int) (( (fptr->Fptr)->headend - (fptr->Fptr)->nextkey ) / 80); /* no. keywords to shift */

    if (nshift <= 0)
    {
        snprintf(message, FLEN_ERRMSG,"Cannot delete keyword number %d.  It does not exist.",
                keypos);
        ffpmsg(message);
        return(*status = KEY_OUT_BOUNDS);
    }

    bytepos = (fptr->Fptr)->headend - 80;  /* last keyword in header */  

    /* construct a blank keyword */
    strcpy(buff2, "                                        ");
    strcat(buff2, "                                        ");
    inbuff  = buff1;
    outbuff = buff2;
    for (ii = 0; ii < nshift; ii++) /* shift each keyword up one position */
    {

        ffmbyt(fptr, bytepos, REPORT_EOF, status);
        ffgbyt(fptr, 80, inbuff, status);   /* read the current keyword */

        ffmbyt(fptr, bytepos, REPORT_EOF, status);
        ffpbyt(fptr, 80, outbuff, status);  /* overwrite with next keyword */

        tmpbuff = inbuff;   /* swap input and output buffers */
        inbuff = outbuff;
        outbuff = tmpbuff;

        bytepos -= 80;
    }

    (fptr->Fptr)->headend -= 80; /* decrement the position of the END keyword */
    return(*status);
}